

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_nest_lock_(void **user_lock)

{
  int iVar1;
  undefined8 in_RDI;
  kmp_int32 gtid_00;
  ident_t *unaff_retaddr;
  int gtid;
  undefined4 in_stack_fffffffffffffff0;
  
  gtid_00 = (kmp_int32)((ulong)in_RDI >> 0x20);
  iVar1 = __kmp_get_global_thread_id_reg();
  __kmpc_set_nest_lock(unaff_retaddr,gtid_00,(void **)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_NEST_LOCK)(void **user_lock) {
#ifdef KMP_STUB
  if (*((kmp_stub_lock_t *)user_lock) == UNINIT) {
    // TODO: Issue an error.
  }
  (*((int *)user_lock))++;
#else
  int gtid = __kmp_entry_gtid();
#if OMPT_SUPPORT && OMPT_OPTIONAL
  OMPT_STORE_RETURN_ADDRESS(gtid);
#endif
  __kmpc_set_nest_lock(NULL, gtid, user_lock);
#endif
}